

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall
kratos::ModuleInstantiationVisitor::visit(ModuleInstantiationVisitor *this,Generator *generator)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  iterator iVar2;
  mapped_type *pmVar3;
  pointer psVar4;
  _Rb_tree_header *p_Var5;
  undefined1 local_d0 [8];
  string comment;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  local_98;
  undefined1 local_80 [8];
  mapped_type info;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_48 [8];
  shared_ptr<kratos::ModuleInstantiationStmt> stmt;
  Generator *generator_local;
  
  if (((generator->is_cloned_ == false) &&
      ((generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && ((generator->is_external_ & 1U) == 0)) {
    stmt.super___shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)generator;
    Generator::get_child_generators(&local_98,generator);
    for (psVar4 = local_98.
                  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar4 != local_98.
                  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
      peVar1 = (psVar4->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1->has_instantiated_ == false) {
        local_d0 = (undefined1  [8])peVar1;
        std::make_shared<kratos::ModuleInstantiationStmt,kratos::Generator*,kratos::Generator*&>
                  ((Generator **)local_48,(Generator **)local_d0);
        if ((char)stmt.
                  super___shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[0xb]._M_weak_count == '\x01') {
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_d0,
                       (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)(stmt.
                           super___shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 0x26));
          iVar2 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_d0,
                         &((psVar4->
                           super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                          )->instance_name);
          if (iVar2.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            pmVar3 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_d0,
                          &((psVar4->
                            super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->instance_name);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)local_80,pmVar3);
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)&(((Stmt *)local_48)->super_IRNode).fn_name_ln,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                        *)local_80);
            std::__cxx11::string::~string((string *)local_80);
          }
          local_80 = (undefined1  [8])0x23fd2f;
          info.first._M_dataplus._M_p._0_4_ = 0xf7;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<char_const*,int>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)&(((Stmt *)local_48)->super_IRNode).fn_name_ln,
                     (pair<const_char_*,_int> *)local_80);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_d0);
        }
        Generator::get_child_comment
                  ((string *)local_d0,
                   (Generator *)
                   stmt.
                   super___shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi,
                   &((psVar4->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->instance_name);
        if (comment._M_dataplus._M_p != (pointer)0x0) {
          std::__cxx11::string::_M_assign((string *)&(((Stmt *)local_48)->super_IRNode).comment);
        }
        this_00._M_pi =
             stmt.super___shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::ModuleInstantiationStmt,void>
                  ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)&info.second,
                   (__shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2> *)
                   local_48);
        Generator::add_stmt((Generator *)this_00._M_pi,(shared_ptr<kratos::Stmt> *)&info.second);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        p_Var5 = &(((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)local_48 + 0x130))->_M_t)._M_impl.super__Rb_tree_header;
        while (p_Var5 = *(_Rb_tree_header **)&p_Var5->_M_header, p_Var5 != (_Rb_tree_header *)0x0) {
          (**(code **)(*(long *)(p_Var5->_M_header)._M_parent + 0x48))();
        }
        ((psVar4->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        instantiation_stmt_ = (ModuleInstantiationStmt *)local_48;
        std::__cxx11::string::~string((string *)local_d0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
      }
    }
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~vector(&local_98);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator->is_cloned() || generator->external()) return;
        for (auto& child : generator->get_child_generators()) {
            // skip if already instantiated
            if (child->has_instantiated()) continue;
            // create instantiation statement
            auto stmt = std::make_shared<ModuleInstantiationStmt>(child.get(), generator);
            if (generator->debug) {
                // get the debug info from the add_generator, if possible
                auto debug_info = generator->children_debug();
                if (debug_info.find(child->instance_name) != debug_info.end()) {
                    auto info = debug_info.at(child->instance_name);
                    stmt->fn_name_ln.emplace_back(info);
                }
                stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            auto comment = generator->get_child_comment(child->instance_name);
            if (!comment.empty()) stmt->comment = comment;
            generator->add_stmt(stmt);
            // remove the stmts that's fold into the instantiation statement
            for (auto const& st : stmt->connection_stmt()) {
                st->remove_from_parent();
            }
            child->set_instantiation_stmt(stmt.get());
        }
    }